

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O2

Table * __thiscall woff2::Font::FindTable(Font *this,uint32_t tag)

{
  iterator iVar1;
  Table *pTVar2;
  uint32_t local_c;
  
  local_c = tag;
  iVar1 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_woff2::Font::Table>,_std::_Select1st<std::pair<const_unsigned_int,_woff2::Font::Table>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
          ::find(&(this->tables)._M_t,&local_c);
  pTVar2 = (Table *)0x0;
  if ((_Rb_tree_header *)iVar1._M_node != &(this->tables)._M_t._M_impl.super__Rb_tree_header) {
    pTVar2 = (Table *)&iVar1._M_node[1]._M_parent;
  }
  return pTVar2;
}

Assistant:

Font::Table* Font::FindTable(uint32_t tag) {
  std::map<uint32_t, Font::Table>::iterator it = tables.find(tag);
  return it == tables.end() ? 0 : &it->second;
}